

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O0

void mserialize::detail::visit_struct<Visitor,std::ifstream>
               (string_view full_tag,string_view tag,Visitor *visitor,
               basic_ifstream<char,_std::char_traits<char>_> *istream,int max_recursion)

{
  StructBegin SVar1;
  FieldBegin FVar2;
  string_view tag_00;
  string_view full_tag_00;
  bool bVar3;
  string_view *in_RCX;
  char *in_RDX;
  size_t in_RDI;
  Visitor *in_R8;
  ifstream *in_R9;
  string_view sVar4;
  string_view sVar5;
  string_view sVar6;
  int unaff_retaddr;
  string_view field_tag;
  string_view field_name;
  bool skip;
  string_view intro;
  char in_stack_fffffffffffffeef;
  string_view *in_stack_fffffffffffffef0;
  string_view *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  string_view *local_b0;
  char *local_50;
  string_view *local_48;
  string_view *psVar7;
  
  string_view::remove_suffix((string_view *)&stack0xffffffffffffffe0,1);
  sVar4 = remove_prefix_before(in_stack_fffffffffffffef0,in_stack_fffffffffffffeef);
  bVar3 = string_view::empty((string_view *)&stack0xffffffffffffffe0);
  local_50 = in_RDX;
  local_b0 = in_RCX;
  if (bVar3) {
    sVar6._len = in_stack_ffffffffffffff20;
    sVar6._ptr = in_stack_ffffffffffffff18;
    sVar5._len = in_stack_ffffffffffffff10;
    sVar5._ptr = in_stack_ffffffffffffff08;
    sVar5 = resolve_recursive_tag(sVar6,sVar5);
    local_50 = sVar5._ptr;
    local_48 = (string_view *)sVar5._len;
    local_b0 = local_48;
  }
  string_view::remove_prefix((string_view *)&stack0xffffffffffffffc0,1);
  SVar1.tag._ptr._0_7_ = (int7)local_50;
  SVar1.name = sVar4;
  SVar1.tag._ptr._7_1_ = (char)((ulong)local_50 >> 0x38);
  SVar1.tag._len = (size_t)local_b0;
  psVar7 = local_b0;
  bVar3 = Visitor::visit<mserialize::Visitor::StructBegin>(in_R8,SVar1,in_R9);
  if (!bVar3) {
    while (bVar3 = string_view::empty((string_view *)&stack0xffffffffffffffe0),
          ((bVar3 ^ 0xffU) & 1) != 0) {
      sVar5 = tag_pop_label(in_stack_ffffffffffffff00);
      sVar6 = tag_pop(local_b0);
      local_b0 = (string_view *)sVar6._len;
      FVar2.tag._ptr._0_7_ = (int7)sVar6._ptr;
      FVar2.name = sVar5;
      FVar2.tag._ptr._7_1_ = sVar6._ptr._7_1_;
      FVar2.tag._len = (size_t)local_b0;
      Visitor::visit<mserialize::Visitor::FieldBegin>(in_R8,FVar2);
      full_tag_00._len = in_RDI;
      full_tag_00._ptr = (char *)psVar7;
      tag_00._len = (size_t)local_50;
      tag_00._ptr = (char *)in_R8;
      visit_impl<Visitor,std::ifstream>
                (full_tag_00,tag_00,(Visitor *)in_R9,
                 (basic_ifstream<char,_std::char_traits<char>_> *)sVar4._len,unaff_retaddr);
      Visitor::visit<mserialize::Visitor::FieldEnd>(in_R8);
    }
    Visitor::visit<mserialize::Visitor::StructEnd>(in_R8);
  }
  return;
}

Assistant:

void visit_struct(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  tag.remove_suffix(1); // drop }

  string_view intro = remove_prefix_before(tag, '`');

  if (tag.empty())
  {
    // perhaps a recursive struct?
    tag = resolve_recursive_tag(full_tag, intro);
  }

  intro.remove_prefix(1); // drop {

  const bool skip = visitor.visit(mserialize::Visitor::StructBegin{intro, tag}, istream);
  if (skip) { return; }

  while (! tag.empty())
  {
    const string_view field_name = tag_pop_label(tag);
    const string_view field_tag = tag_pop(tag);

    visitor.visit(mserialize::Visitor::FieldBegin{field_name, field_tag});

    visit_impl(full_tag, field_tag, visitor, istream, max_recursion);

    visitor.visit(mserialize::Visitor::FieldEnd{});
  }

  visitor.visit(mserialize::Visitor::StructEnd{});
}